

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O3

int skiwi::_skiwi_file_exists(char *filename)

{
  char cVar1;
  ifstream f;
  undefined1 local_210 [520];
  
  std::ifstream::ifstream(local_210,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_210);
  return (uint)(cVar1 != '\0');
}

Assistant:

int _skiwi_file_exists(const char* filename)
  {
#ifdef _WIN32
  int res = 0;
  std::string sname(filename);
  std::wstring wname = convert_string_to_wstring(sname);
  std::ifstream f(wname);
  if (f.is_open())
    {
    res = 1;
    f.close();
    }
  return res;
#else
  int res = 0;
  std::ifstream f(filename);
  if (f.is_open())
    {
    res = 1;
    f.close();
    }
  return res;
#endif
  }